

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QPalette __thiscall QMdiSubWindowPrivate::desktopPalette(QMdiSubWindowPrivate *this)

{
  QMdiSubWindow *pQVar1;
  QPalette *pQVar2;
  undefined8 extraout_RDX;
  QMdiSubWindowPrivate *in_RSI;
  QWidget *in_RDI;
  QPalette QVar3;
  QMdiSubWindow *q;
  QPalette *newPalette;
  ColorRole in_stack_ffffffffffffffc8;
  ColorGroup in_stack_ffffffffffffffcc;
  QWidget *this_00;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  
  this_00 = in_RDI;
  pQVar1 = q_func(in_RSI);
  uVar4 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QWidget::palette(this_00);
  QPalette::QPalette((QPalette *)in_RDI,(QPalette *)pQVar2);
  QPalette::color((QPalette *)this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  QPalette::setColor((QPalette *)in_RSI,(ColorGroup)((ulong)pQVar1 >> 0x20),(ColorRole)pQVar1,
                     (QColor *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
  QPalette::color((QPalette *)this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  QPalette::setColor((QPalette *)in_RSI,(ColorGroup)((ulong)pQVar1 >> 0x20),(ColorRole)pQVar1,
                     (QColor *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
  QPalette::color((QPalette *)this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  QPalette::setColor((QPalette *)in_RSI,(ColorGroup)((ulong)pQVar1 >> 0x20),(ColorRole)pQVar1,
                     (QColor *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
  QPalette::color((QPalette *)this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  QPalette::setColor((QPalette *)in_RSI,(ColorGroup)((ulong)pQVar1 >> 0x20),(ColorRole)pQVar1,
                     (QColor *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
  QPalette::color((QPalette *)this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  QPalette::setColor((QPalette *)in_RSI,(ColorGroup)((ulong)pQVar1 >> 0x20),(ColorRole)pQVar1,
                     (QColor *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
  QVar3._8_8_ = extraout_RDX;
  QVar3.d = (QPalettePrivate *)this_00;
  return QVar3;
}

Assistant:

QPalette QMdiSubWindowPrivate::desktopPalette() const
{
    Q_Q(const QMdiSubWindow);
    QPalette newPalette = q->palette();

    newPalette.setColor(QPalette::Active, QPalette::Highlight,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Active, QPalette::Base,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Inactive, QPalette::Highlight,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::Base,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::HighlightedText,
                        newPalette.color(QPalette::Inactive, QPalette::Window));

    return newPalette;
}